

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  bool bVar1;
  int file_descriptor;
  pointer ppFVar2;
  FileDescriptorProto *proto;
  int *piVar3;
  ostream *poVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  ulong uVar8;
  FileDescriptorSet file_set;
  FileOutputStream out;
  FileDescriptorSet local_b0;
  undefined1 local_80 [16];
  _Base_ptr local_70;
  _Base_ptr local_68;
  ZeroCopyOutputStream local_60;
  CopyingOutputStream *local_58;
  
  FileDescriptorSet::FileDescriptorSet(&local_b0);
  if (this->imports_in_descriptor_set_ == false) {
    if ((parsed_files->
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (parsed_files->
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      uVar8 = 0;
      do {
        if (local_b0.file_.super_RepeatedPtrFieldBase.current_size_ <
            local_b0.file_.super_RepeatedPtrFieldBase.allocated_size_) {
          proto = (FileDescriptorProto *)
                  local_b0.file_.super_RepeatedPtrFieldBase.elements_
                  [local_b0.file_.super_RepeatedPtrFieldBase.current_size_];
        }
        else {
          if (local_b0.file_.super_RepeatedPtrFieldBase.allocated_size_ ==
              local_b0.file_.super_RepeatedPtrFieldBase.total_size_) {
            internal::RepeatedPtrFieldBase::Reserve
                      (&local_b0.file_.super_RepeatedPtrFieldBase,
                       local_b0.file_.super_RepeatedPtrFieldBase.total_size_ + 1);
          }
          local_b0.file_.super_RepeatedPtrFieldBase.allocated_size_ =
               local_b0.file_.super_RepeatedPtrFieldBase.allocated_size_ + 1;
          proto = internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>::New();
          local_b0.file_.super_RepeatedPtrFieldBase.elements_
          [local_b0.file_.super_RepeatedPtrFieldBase.current_size_] = proto;
        }
        local_b0.file_.super_RepeatedPtrFieldBase.current_size_ =
             local_b0.file_.super_RepeatedPtrFieldBase.current_size_ + 1;
        FileDescriptor::CopyTo
                  ((parsed_files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar8],proto);
        if (this->source_info_in_descriptor_set_ == true) {
          FileDescriptor::CopySourceCodeInfoTo
                    ((parsed_files->
                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar8],proto);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)((long)(parsed_files->
                                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(parsed_files->
                                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  else {
    local_68 = (_Base_ptr)(local_80 + 8);
    local_80._8_4_ = _S_red;
    local_70 = (_Base_ptr)0x0;
    local_58 = (CopyingOutputStream *)0x0;
    ppFVar2 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_60._vptr_ZeroCopyOutputStream = (_func_int **)local_68;
    if ((parsed_files->
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
      uVar8 = 0;
      do {
        GetTransitiveDependencies
                  (ppFVar2[uVar8],this->source_info_in_descriptor_set_,
                   (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)local_80,&local_b0.file_);
        uVar8 = uVar8 + 1;
        ppFVar2 = (parsed_files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar8 < (ulong)((long)(parsed_files->
                                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >>
                              3));
    }
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)local_80);
  }
  do {
    file_descriptor = open((this->descriptor_set_name_)._M_dataplus._M_p,0x241,0x1b6);
    if (-1 < file_descriptor) {
      io::FileOutputStream::FileOutputStream((FileOutputStream *)local_80,file_descriptor,-1);
      bVar1 = MessageLite::SerializeToZeroCopyStream
                        ((MessageLite *)&local_b0,(ZeroCopyOutputStream *)local_80);
      if (bVar1) {
        bVar1 = io::FileOutputStream::Close((FileOutputStream *)local_80);
        bVar7 = true;
        if (!bVar1) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(this->descriptor_set_name_)._M_dataplus._M_p,
                              (this->descriptor_set_name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
          pcVar5 = strerror((int)local_68);
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
          }
          else {
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          goto LAB_001825d8;
        }
      }
      else {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->descriptor_set_name_)._M_dataplus._M_p,
                            (this->descriptor_set_name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        pcVar5 = strerror((int)local_68);
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar6 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar6);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        io::FileOutputStream::Close((FileOutputStream *)local_80);
LAB_001825d8:
        bVar7 = false;
      }
      io::FileOutputStream::~FileOutputStream((FileOutputStream *)local_80);
      goto LAB_001825e4;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  perror((this->descriptor_set_name_)._M_dataplus._M_p);
  bVar7 = false;
LAB_001825e4:
  FileDescriptorSet::~FileDescriptorSet(&local_b0);
  return bVar7;
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const vector<const FileDescriptor*> parsed_files) {
  FileDescriptorSet file_set;

  if (imports_in_descriptor_set_) {
    set<const FileDescriptor*> already_seen;
    for (int i = 0; i < parsed_files.size(); i++) {
      GetTransitiveDependencies(parsed_files[i],
                                source_info_in_descriptor_set_,
                                &already_seen, file_set.mutable_file());
    }
  } else {
    for (int i = 0; i < parsed_files.size(); i++) {
      FileDescriptorProto* file_proto = file_set.add_file();
      parsed_files[i]->CopyTo(file_proto);
      if (source_info_in_descriptor_set_) {
        parsed_files[i]->CopySourceCodeInfoTo(file_proto);
      }
    }
  }

  int fd;
  do {
    fd = open(descriptor_set_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  if (!file_set.SerializeToZeroCopyStream(&out)) {
    cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno()) << endl;
    out.Close();
    return false;
  }
  if (!out.Close()) {
    cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno()) << endl;
    return false;
  }

  return true;
}